

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O0

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  size_t sVar1;
  bool bVar2;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar3;
  char *pcVar4;
  ulong uVar5;
  StringPtr SVar6;
  ArrayPtr<const_char> local_108;
  long local_f8;
  TestCase *testCase;
  char *local_e8;
  undefined1 local_e0 [8];
  GlobFilter filter;
  char *part2;
  undefined1 auStack_88 [7];
  bool parsedRange;
  StringPtr lineStr;
  char *end;
  StringPtr local_60;
  undefined1 local_50 [8];
  NullableValue<unsigned_long> colonPos;
  uint maxLine;
  uint minLine;
  ArrayPtr<const_char> filePattern;
  TestRunner *this_local;
  StringPtr pattern_local;
  
  pattern_local.content.ptr = (char *)pattern.content.size_;
  this_local = (TestRunner *)pattern.content.ptr;
  this->hasFilter = true;
  pattern_local.content.size_ = (size_t)__return_storage_ptr__;
  _maxLine = StringPtr::operator_cast_to_ArrayPtr((StringPtr *)&this_local);
  colonPos.field_1.value._4_4_ = MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
  colonPos.field_1.value._0_4_ = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  StringPtr::findLast(&local_60,(char)(StringPtr *)&this_local);
  other = _::readMaybe<unsigned_long>((Maybe<unsigned_long> *)&local_60);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_50,other);
  Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&local_60);
  puVar3 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_50);
  if (puVar3 != (unsigned_long *)0x0) {
    puVar3 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_50);
    SVar6 = StringPtr::slice((StringPtr *)&this_local,*puVar3 + 1);
    lineStr.content.ptr = (char *)SVar6.content.size_;
    _auStack_88 = SVar6.content.ptr;
    bVar2 = false;
    pcVar4 = StringPtr::cStr((StringPtr *)auStack_88);
    uVar5 = strtoul(pcVar4,(char **)&lineStr.content.size_,0);
    sVar1 = lineStr.content.size_;
    colonPos.field_1.value._4_4_ = (undefined4)uVar5;
    pcVar4 = StringPtr::begin((StringPtr *)auStack_88);
    if ((char *)sVar1 != pcVar4) {
      if (*(char *)lineStr.content.size_ == '-') {
        pcVar4 = (char *)(lineStr.content.size_ + 1);
        uVar5 = strtoul(pcVar4,(char **)&lineStr.content.size_,0);
        colonPos.field_1.value._0_4_ = (undefined4)uVar5;
        if ((pcVar4 < lineStr.content.size_) && (*(char *)lineStr.content.size_ == '\0')) {
          bVar2 = true;
        }
      }
      else {
        bVar2 = *(char *)lineStr.content.size_ == '\0';
        if (bVar2) {
          colonPos.field_1.value._0_4_ = colonPos.field_1.value._4_4_;
        }
      }
    }
    if (bVar2) {
      puVar3 = _::NullableValue<unsigned_long>::operator*((NullableValue<unsigned_long> *)local_50);
      _maxLine = StringPtr::slice((StringPtr *)&this_local,0,*puVar3);
      filter.states.builder.disposer = (ArrayDisposer *)(char *)maxLine;
    }
    else {
      colonPos.field_1.value._4_4_ =
           MinValue_::operator_cast_to_unsigned_int((MinValue_ *)&minValue);
      colonPos.field_1.value._0_4_ =
           MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
    }
  }
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_50);
  testCase = _maxLine;
  local_e8 = filePattern.ptr;
  _::GlobFilter::GlobFilter((GlobFilter *)local_e0,_maxLine);
  for (local_f8 = (anonymous_namespace)::testCasesHead; local_f8 != 0;
      local_f8 = *(long *)(local_f8 + 0x20)) {
    if ((*(byte *)(local_f8 + 0x30) & 1) == 0) {
      StringPtr::StringPtr((StringPtr *)&local_108,*(char **)(local_f8 + 8));
      bVar2 = _::GlobFilter::matches((GlobFilter *)local_e0,(StringPtr)local_108);
      if (((bVar2) && ((uint)colonPos.field_1.value._4_4_ <= *(uint *)(local_f8 + 0x10))) &&
         (*(uint *)(local_f8 + 0x10) <= (uint)colonPos.field_1.value._0_4_)) {
        *(undefined1 *)(local_f8 + 0x30) = 1;
      }
    }
  }
  MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  _::GlobFilter::~GlobFilter((GlobFilter *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_MAYBE(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(*colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.slice(0, *colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    _::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }